

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyLoop::~IfcPolyLoop(IfcPolyLoop *this)

{
  ~IfcPolyLoop((IfcPolyLoop *)&this[-1].super_IfcLoop.field_0x40);
  return;
}

Assistant:

IfcPolyLoop() : Object("IfcPolyLoop") {}